

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

bool __thiscall iDynTree::Visualizer::run(Visualizer *this)

{
  iDynTree::reportError
            ("Visualizer","run",
             "Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht."
            );
  return false;
}

Assistant:

bool Visualizer::run()
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer","run","Impossible to run not initialized visualizer");
        return false;
    }
    bool shouldClose = false;

#ifdef IDYNTREE_USE_GLFW_WINDOW
    shouldClose = glfwWindowShouldClose(pimpl->m_window);
#endif

    return pimpl->m_irrDevice->run() && !shouldClose;
#else
    reportError("Visualizer","run","Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht.");
    return false;
#endif
}